

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

int vs_vlc(bitstream *str,uint32_t *val,vs_vlc_val *tab)

{
  int iVar1;
  long in_RDX;
  int *in_RSI;
  int *in_RDI;
  int n;
  uint32_t bit_1 [32];
  int j_1;
  int i_1;
  uint32_t bit;
  int j;
  int i;
  int in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  bitstream *in_stack_ffffffffffffff48;
  int local_34;
  int local_30;
  int local_28;
  int local_24;
  
  if (*in_RDI == 0) {
    local_24 = 0;
    while (*(int *)(in_RDX + (long)local_24 * 0x88 + 4) != 0) {
      if (*in_RSI == *(int *)(in_RDX + (long)local_24 * 0x88)) {
        local_28 = 0;
        while( true ) {
          if (*(int *)(in_RDX + (long)local_24 * 0x88 + 4) <= local_28) {
            return 0;
          }
          iVar1 = vs_u(in_stack_ffffffffffffff48,
                       (uint32_t *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       in_stack_ffffffffffffff3c);
          if (iVar1 != 0) break;
          local_28 = local_28 + 1;
        }
        return 1;
      }
      local_24 = local_24 + 1;
    }
    fprintf(_stderr,"No VLC code for a value\n");
  }
  else {
    iVar1 = 0;
    local_30 = 0;
    while (*(int *)(in_RDX + (long)local_30 * 0x88 + 4) != 0) {
      for (local_34 = 0; local_34 < *(int *)(in_RDX + (long)local_30 * 0x88 + 4);
          local_34 = local_34 + 1) {
        if (local_34 == iVar1) {
          iVar1 = vs_u(in_stack_ffffffffffffff48,
                       (uint32_t *)CONCAT44(iVar1,in_stack_ffffffffffffff40),
                       in_stack_ffffffffffffff3c);
          if (iVar1 != 0) {
            return 1;
          }
          iVar1 = local_34 + 1;
        }
        if (*(int *)(&stack0xffffffffffffff48 + (long)local_34 * 4) !=
            *(int *)(in_RDX + (long)local_30 * 0x88 + 8 + (long)local_34 * 4)) break;
      }
      if (local_34 == *(int *)(in_RDX + (long)local_30 * 0x88 + 4)) {
        *in_RSI = *(int *)(in_RDX + (long)local_30 * 0x88);
        return 0;
      }
      local_30 = local_30 + 1;
    }
    fprintf(_stderr,"Invalid VLC code\n");
  }
  return 1;
}

Assistant:

int vs_vlc(struct bitstream *str, uint32_t *val, const struct vs_vlc_val *tab) {
	if (str->dir == VS_ENCODE) {
		int i, j;
		for (i = 0; tab[i].blen; i++) {
			if (*val == tab[i].val) {
				uint32_t bit;
				for (j = 0; j < tab[i].blen; j++) {
					bit = tab[i].bits[j];
					if (vs_u(str, &bit, 1))
						return 1;
				}
				return 0;
			}
		}
		fprintf(stderr, "No VLC code for a value\n");
		return 1;
	} else {
		int i, j;
		uint32_t bit[32];
		int n = 0;
		for (i = 0; tab[i].blen; i++) {
			for (j = 0; j < tab[i].blen; j++) {
				if (j == n) {
					if (vs_u(str, &bit[j], 1)) return 1;
					n = j + 1;
				}
				if (bit[j] != tab[i].bits[j])
					break;
			}
			if (j == tab[i].blen) {
				*val = tab[i].val;
				return 0;
			}
		}
		fprintf(stderr, "Invalid VLC code\n");
		return 1;
	}
}